

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskFileManager.cpp
# Opt level: O2

void __thiscall supermap::io::DiskFileManager::swap(DiskFileManager *this,path *first,path *second)

{
  path pStack_68;
  string temp_name;
  
  std::filesystem::__cxx11::path::string(&pStack_68._M_pathname,first);
  std::operator+(&temp_name,&pStack_68._M_pathname,"-swap");
  std::__cxx11::string::~string((string *)&pStack_68);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&pStack_68,&temp_name,auto_format);
  (*(this->super_FileManager)._vptr_FileManager[3])(this,first,&pStack_68);
  std::filesystem::__cxx11::path::~path(&pStack_68);
  (*(this->super_FileManager)._vptr_FileManager[3])(this,second,first);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&pStack_68,&temp_name,auto_format);
  (*(this->super_FileManager)._vptr_FileManager[3])(this,&pStack_68,second);
  std::filesystem::__cxx11::path::~path(&pStack_68);
  std::__cxx11::string::~string((string *)&temp_name);
  return;
}

Assistant:

void DiskFileManager::swap(const std::filesystem::path &first, const std::filesystem::path &second) {
    const std::string temp_name = first.string() + "-swap";
    rename(first, temp_name);
    rename(second, first);
    rename(temp_name, second);
}